

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::Common::DynamicStringPair::copyInto(DynamicStringPair *this,uint8 *buffer)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 o;
  uint8 *buffer_local;
  DynamicStringPair *this_local;
  
  uVar1 = DynamicString::copyInto(&this->key,buffer);
  uVar2 = DynamicString::copyInto(&this->value,buffer + uVar1);
  return uVar2 + uVar1;
}

Assistant:

uint32 copyInto(uint8 * buffer) const { uint32 o = key.copyInto(buffer); o += value.copyInto(buffer+o); return o; }